

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogRemove(void)

{
  int val;
  xmlChar *val_00;
  undefined4 local_1c;
  int n_value;
  xmlChar *value;
  int ret_val;
  int test_ret;
  
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    val_00 = gen_const_xmlChar_ptr(local_1c,0);
    val = xmlCatalogRemove(val_00);
    desret_int(val);
    call_tests = call_tests + 1;
    des_const_xmlChar_ptr(local_1c,val_00,0);
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlCatalogRemove(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int ret_val;
    const xmlChar * value; /* the value to remove */
    int n_value;

    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
        value = gen_const_xmlChar_ptr(n_value, 0);

        ret_val = xmlCatalogRemove(value);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_value, value, 0);
        xmlResetLastError();
    }
    function_tests++;
#endif

    return(test_ret);
}